

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_basic.c
# Opt level: O1

void test_memory_leaks(char *dir,int key_gt_1K,vmemcache_repl_p repl_p,uint seed)

{
  char cVar1;
  int iVar2;
  VMEMcache *pVVar3;
  size_t sVar4;
  VMEMcache *cache;
  void *pvVar5;
  size_t sVar6;
  int *piVar7;
  undefined8 extraout_RAX;
  long lVar8;
  void *__dest;
  undefined8 uVar9;
  ulong extraout_RDX;
  long unaff_RBX;
  char *pcVar10;
  uint uVar11;
  undefined4 uVar12;
  stat_t *__s;
  VMEMcache *pVVar13;
  stat_t sVar14;
  undefined *puVar15;
  void *__src;
  void *pvVar16;
  char *unaff_R12;
  size_t unaff_R13;
  stat_t *psVar17;
  stat_t *get;
  char *pcVar18;
  ulong __n;
  undefined **ppuVar19;
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  char acStack_768 [24];
  undefined8 uStack_750;
  undefined1 auStack_748 [64];
  undefined1 auStack_708 [32];
  undefined1 auStack_6e8 [16];
  undefined1 *apuStack_6d8 [2];
  long alStack_6c8 [2];
  undefined1 *puStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined1 *puStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 uStack_680;
  undefined1 *puStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined1 *puStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 uStack_640;
  undefined1 *puStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined1 *puStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  undefined1 *puStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined1 *puStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_5c0;
  undefined1 *puStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined1 *puStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 uStack_580;
  undefined1 *puStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined1 *puStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 uStack_540;
  undefined1 *puStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined1 *puStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined1 *puStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  long lStack_4d0;
  char *pcStack_4c8;
  VMEMcache *pVStack_4c0;
  char *pcStack_4b8;
  size_t sStack_4b0;
  char *pcStack_4a8;
  VMEMcache *pVStack_4a0;
  code *pcStack_498;
  long lStack_490;
  char *pcStack_488;
  stat_t *psStack_480;
  VMEMcache *pVStack_478;
  code *pcStack_470;
  size_t *in_stack_fffffffffffffb98;
  stat_t in_stack_fffffffffffffba0;
  big_key bk;
  size_t local_50;
  size_t vsize;
  ulong local_40;
  stat_t n_evicts;
  stat_t n_puts;
  long lVar21;
  
  pcStack_470 = (code *)0x105ffc;
  vsize._4_4_ = key_gt_1K;
  srand(repl_p);
  n_evicts = 0;
  local_40 = 0;
  pcStack_470 = (code *)0x10600b;
  pVVar3 = (VMEMcache *)vmemcache_new();
  pcStack_470 = (code *)0x10601b;
  vmemcache_set_size(pVVar3,0x100000);
  pcStack_470 = (code *)0x106028;
  vmemcache_set_extent_size(pVVar3,0x100);
  pcStack_470 = (code *)0x106035;
  vmemcache_set_eviction_policy(pVVar3,1);
  pcStack_470 = (code *)0x106040;
  pcVar18 = dir;
  ppuVar19 = (undefined **)pVVar3;
  iVar2 = vmemcache_add();
  uVar11 = (uint)pcVar18;
  if (iVar2 == 0) {
    pcStack_470 = (code *)0x10605e;
    vmemcache_callback_on_evict(pVVar3,on_evict_test_memory_leaks_cb,&local_40);
    get = (stat_t *)0x0;
    pcVar18 = unaff_R12;
    while (local_40 < 1000) {
      pcStack_470 = (code *)0x106079;
      iVar2 = rand();
      dir = (char *)(long)iVar2;
      unaff_RBX = ((ulong)dir / 0xff81) * 0xff81;
      unaff_R13 = (ulong)dir % 0xff81 + 0x80;
      pcStack_470 = (code *)0x1060b0;
      unaff_R12 = (char *)malloc(unaff_R13);
      if (unaff_R12 == (char *)0x0) {
LAB_00106239:
        unaff_R12 = pcVar18;
        pcStack_470 = (code *)0x10623e;
        test_memory_leaks_cold_9();
        psVar17 = (stat_t *)dir;
LAB_0010623e:
        dir = (char *)psVar17;
        pcStack_470 = (code *)0x106243;
        test_memory_leaks_cold_8();
LAB_00106243:
        pcStack_470 = (code *)0x10624e;
        test_memory_leaks_cold_5();
LAB_0010624e:
        pcStack_470 = (code *)0x10625a;
        test_memory_leaks_cold_4();
LAB_0010625a:
        pcStack_470 = (code *)0x106265;
        test_memory_leaks_cold_3();
LAB_00106265:
        ppuVar19 = (undefined **)&n_evicts;
        uVar11 = (uint)&local_40;
        pcStack_470 = (code *)0x106272;
        test_memory_leaks_cold_2();
        goto LAB_00106272;
      }
      psVar17 = (stat_t *)((ulong)dir % 0xff81);
      pcStack_470 = (code *)0x1060d0;
      memset(unaff_R12,0x2a,(size_t)((long)psVar17 + 0x7f));
      (unaff_R12 + 0x7f)[(long)psVar17] = '\0';
      if (vsize._4_4_ == 0) {
        uVar9 = 8;
        __s = &n_evicts;
      }
      else {
        __s = (stat_t *)&stack0xfffffffffffffba0;
        pcStack_470 = (code *)0x1060f5;
        memset(__s,0x2a,0x400);
        uVar9 = 0x408;
        psVar17 = __s;
      }
      pcStack_470 = (code *)0x106121;
      iVar2 = vmemcache_put(pVVar3,__s,uVar9,unaff_R12,unaff_R13);
      dir = (char *)psVar17;
      if (iVar2 != 0) goto LAB_00106265;
      pcStack_470 = (code *)0x106131;
      dir = (char *)malloc(unaff_R13);
      if ((stat_t *)dir == (stat_t *)0x0) goto LAB_0010623e;
      if (vsize._4_4_ == 0) {
        uVar9 = 8;
        psVar17 = &n_evicts;
      }
      else {
        uVar9 = 0x408;
        psVar17 = (stat_t *)&stack0xfffffffffffffba0;
      }
      in_stack_fffffffffffffb98 = &local_50;
      pcStack_470 = (code *)0x10617e;
      sVar4 = vmemcache_get(pVVar3,psVar17,uVar9,dir,unaff_R13,0);
      pcVar18 = unaff_R12;
      if ((long)sVar4 < 0) {
        pcStack_470 = (code *)0x106239;
        test_memory_leaks_cold_7();
        goto LAB_00106239;
      }
      if (sVar4 != unaff_R13) goto LAB_0010625a;
      if (unaff_R13 != local_50) goto LAB_0010624e;
      pcStack_470 = (code *)0x1061a5;
      iVar2 = strcmp(unaff_R12,dir);
      if (iVar2 != 0) goto LAB_00106243;
      pcStack_470 = (code *)0x1061b5;
      free(unaff_R12);
      pcStack_470 = (code *)0x1061bd;
      free(dir);
      n_evicts = n_evicts + 1;
      get = (stat_t *)((long)get + 1);
    }
    pcStack_470 = (code *)0x1061e7;
    verify_stat_entries(pVVar3,n_evicts - local_40);
    do {
      pcStack_470 = (code *)0x1061f3;
      iVar2 = vmemcache_evict(pVVar3,0,0);
    } while (iVar2 == 0);
    pcStack_470 = (code *)0x106210;
    sVar14 = n_evicts;
    verify_stats(pVVar3,n_evicts,(stat_t)get,(stat_t)get,0,local_40,
                 (stat_t)in_stack_fffffffffffffb98,in_stack_fffffffffffffba0,bk.buf._0_8_);
    uVar11 = (uint)sVar14;
    pcStack_470 = (code *)0x106218;
    ppuVar19 = (undefined **)pVVar3;
    vmemcache_delete();
    unaff_R12 = pcVar18;
    dir = (char *)get;
    if (local_40 == n_evicts) {
      return;
    }
  }
  else {
LAB_00106272:
    pcStack_470 = (code *)0x106277;
    test_memory_leaks_cold_1();
  }
  pcStack_470 = test_merge_allocations;
  test_memory_leaks_cold_6();
  pcVar18 = (char *)(ulong)uVar11;
  pcStack_498 = (code *)0x106292;
  lStack_490 = unaff_RBX;
  pcStack_488 = unaff_R12;
  psStack_480 = (stat_t *)dir;
  pVStack_478 = pVVar3;
  pcStack_470 = (code *)&stack0xfffffffffffffff8;
  cache = (VMEMcache *)vmemcache_new();
  pcStack_498 = (code *)0x1062a2;
  vmemcache_set_size(cache,0x100000);
  pcStack_498 = (code *)0x1062af;
  vmemcache_set_extent_size(cache,0x100);
  pcStack_498 = (code *)0x1062ba;
  vmemcache_set_eviction_policy(cache,pcVar18);
  pcStack_498 = (code *)0x1062c5;
  pVVar13 = (VMEMcache *)ppuVar19;
  pVVar3 = cache;
  iVar2 = vmemcache_add();
  uVar12 = SUB84(pVVar13,0);
  if (iVar2 != 0) goto LAB_001063c5;
  unaff_R12 = (char *)0x0;
  sVar14 = 0;
  pcStack_498 = (code *)0x1062da;
  verify_stat_entries(cache,0);
  pcStack_498 = (code *)0x1062e2;
  verify_heap_entries(cache,sVar14);
  ppuVar19 = &PTR_anon_var_dwarf_5a6_0010bda0;
  pcVar18 = "VALUE";
  do {
    uVar9 = *(undefined8 *)(unaff_R12 + 0x10bda0);
    pcStack_498 = (code *)0x10630a;
    pVVar3 = cache;
    iVar2 = vmemcache_put(cache,uVar9,6,"VALUE",6);
    uVar12 = (undefined4)uVar9;
    if (iVar2 != 0) {
      pcStack_498 = (code *)0x1063c0;
      test_merge_allocations_cold_2();
      goto LAB_001063c0;
    }
    unaff_R12 = unaff_R12 + 8;
  } while (unaff_R12 != (char *)0x28);
  sVar14 = 5;
  pcStack_498 = (code *)0x106329;
  verify_stat_entries(cache,5);
  pcStack_498 = (code *)0x106331;
  verify_heap_entries(cache,sVar14);
  pcVar18 = (char *)0x0;
  unaff_R12 = "\x01";
  do {
    puVar15 = (&PTR_anon_var_dwarf_5a6_0010bda0)[*(uint *)((long)&DAT_00108cb0 + (long)pcVar18)];
    pcStack_498 = (code *)0x106350;
    pVVar3 = cache;
    iVar2 = vmemcache_evict(cache,puVar15,6);
    uVar12 = SUB84(puVar15,0);
    if (iVar2 == -1) goto LAB_001063c0;
    pcVar18 = pcVar18 + 4;
  } while (pcVar18 != (char *)0x14);
  sVar14 = 0;
  pcStack_498 = (code *)0x106369;
  verify_stat_entries(cache,0);
  pcStack_498 = (code *)0x106371;
  verify_heap_entries(cache,sVar14);
  uVar12 = 0x108a47;
  pcStack_498 = (code *)0x106392;
  pVVar3 = cache;
  iVar2 = vmemcache_put(cache,"KEY_1",6,"VALUE",6);
  if (iVar2 == 0) {
    sVar14 = 1;
    pcStack_498 = (code *)0x1063a3;
    verify_stat_entries(cache,1);
    pcStack_498 = (code *)0x1063ab;
    verify_heap_entries(cache,sVar14);
    vmemcache_delete(cache);
    return;
  }
LAB_001063ca:
  pcStack_498 = test_offsets;
  test_merge_allocations_cold_3();
  pcVar10 = auStack_748;
  apuStack_6d8[0] = auStack_708;
  apuStack_6d8[1] = (undefined1 *)0x20;
  alStack_6c8[0] = 0;
  alStack_6c8[1] = 0x20;
  uStack_6b0 = 0x20;
  uStack_6a8 = 2;
  uStack_6a0 = 0x1e;
  uStack_690 = 0x20;
  uStack_688 = 0x1f;
  uStack_680 = 1;
  uStack_670 = 0x20;
  uStack_668 = 0x20;
  uStack_660 = 0;
  uStack_650 = 0x20;
  uStack_648 = 0x21;
  uStack_640 = 0;
  puStack_638 = auStack_748;
  uStack_630 = 0x40;
  uStack_628 = 0;
  uStack_620 = 0x20;
  uStack_610 = 0x40;
  uStack_608 = 4;
  uStack_600 = 0x1c;
  uStack_5f0 = 0x40;
  uStack_5e8 = 0x1f;
  uStack_5e0 = 1;
  uStack_5d0 = 0x40;
  uStack_5c8 = 0x20;
  uStack_5c0 = 0;
  uStack_5b0 = 0x40;
  uStack_5a8 = 0x21;
  uStack_5a0 = 0;
  puStack_598 = auStack_6e8;
  uStack_590 = 0x10;
  uStack_588 = 0;
  uStack_580 = 0x10;
  uStack_570 = 0x10;
  uStack_568 = 2;
  uStack_560 = 0x10;
  uStack_550 = 0x10;
  uStack_548 = 0x10;
  uStack_540 = 0x10;
  uStack_530 = 0x10;
  uStack_528 = 0x12;
  uStack_520 = 0xe;
  uStack_510 = 0x10;
  uStack_508 = 0x20;
  uStack_500 = 0;
  uStack_4f0 = 0x10;
  uStack_4e8 = 0x21;
  uStack_4e0 = 0;
  uStack_750 = 0x1065e7;
  puStack_6b8 = apuStack_6d8[0];
  puStack_698 = apuStack_6d8[0];
  puStack_678 = apuStack_6d8[0];
  puStack_658 = apuStack_6d8[0];
  puStack_618 = puStack_638;
  puStack_5f8 = puStack_638;
  puStack_5d8 = puStack_638;
  puStack_5b8 = puStack_638;
  puStack_578 = puStack_598;
  puStack_558 = puStack_598;
  puStack_538 = puStack_598;
  puStack_518 = puStack_598;
  puStack_4f8 = puStack_598;
  pVStack_4c0 = cache;
  pcStack_4b8 = unaff_R12;
  sStack_4b0 = unaff_R13;
  pcStack_4a8 = pcVar18;
  pVStack_4a0 = (VMEMcache *)ppuVar19;
  pcStack_498 = (code *)&pcStack_470;
  pvVar5 = (void *)vmemcache_new();
  uStack_750 = 0x1065f7;
  vmemcache_set_size(pvVar5,0x100000);
  uStack_750 = 0x106604;
  vmemcache_set_extent_size(pvVar5,0x100);
  uStack_750 = 0x10660f;
  vmemcache_set_eviction_policy(pvVar5,uVar12);
  uStack_750 = 0x10661a;
  pvVar16 = pvVar5;
  iVar2 = vmemcache_add(pvVar5,pVVar3);
  if (iVar2 == 0) {
    pcVar10 = acStack_768;
    lVar8 = 0;
    auVar20 = _DAT_00108030;
    auVar22 = _DAT_00108040;
    auVar23 = _DAT_00108050;
    auVar24 = _DAT_00108060;
    auVar25 = _DAT_00108070;
    auVar26 = _DAT_00108080;
    auVar27 = _DAT_00108090;
    auVar28 = _DAT_001080a0;
    do {
      auVar29 = auVar28 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar39._4_4_ = iVar2;
      auVar39._0_4_ = iVar2;
      auVar39._8_4_ = iVar38;
      auVar39._12_4_ = iVar38;
      auVar47._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar47._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar47._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar47._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar30._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30 = auVar30 & auVar47;
      auVar29 = pshuflw(auVar39,auVar30,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      cVar1 = (char)lVar8;
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_768[lVar8] = cVar1 + 'a';
      }
      auVar29 = packssdw(auVar30,auVar30);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 1] = cVar1 + 'b';
      }
      auVar29 = auVar27 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar40._4_4_ = iVar2;
      auVar40._0_4_ = iVar2;
      auVar40._8_4_ = iVar38;
      auVar40._12_4_ = iVar38;
      auVar48._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar48._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar48._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar48._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar31._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31 = auVar31 & auVar48;
      auVar29 = packssdw(auVar40,auVar31);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
        acStack_768[lVar8 + 2] = cVar1 + 'c';
      }
      auVar29 = pshufhw(auVar31,auVar31,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 0x18 & 1) != 0) {
        acStack_768[lVar8 + 3] = cVar1 + 'd';
      }
      auVar29 = auVar26 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar41._4_4_ = iVar2;
      auVar41._0_4_ = iVar2;
      auVar41._8_4_ = iVar38;
      auVar41._12_4_ = iVar38;
      auVar49._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar49._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar49._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar49._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar32._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32 = auVar32 & auVar49;
      auVar29 = pshuflw(auVar41,auVar32,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 4] = cVar1 + 'e';
      }
      auVar29 = packssdw(auVar32,auVar32);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._4_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 5] = cVar1 + 'f';
      }
      auVar29 = auVar25 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar42._4_4_ = iVar2;
      auVar42._0_4_ = iVar2;
      auVar42._8_4_ = iVar38;
      auVar42._12_4_ = iVar38;
      auVar50._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar50._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar50._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar50._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar33._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33 = auVar33 & auVar50;
      auVar29 = packssdw(auVar42,auVar33);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 6] = cVar1 + 'g';
      }
      auVar29 = pshufhw(auVar33,auVar33,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._6_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 7] = cVar1 + 'h';
      }
      auVar29 = auVar24 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar43._4_4_ = iVar2;
      auVar43._0_4_ = iVar2;
      auVar43._8_4_ = iVar38;
      auVar43._12_4_ = iVar38;
      auVar51._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar51._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar51._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar51._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar34._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar34._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar34._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar34._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar34 = auVar34 & auVar51;
      auVar29 = pshuflw(auVar43,auVar34,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 8] = cVar1 + 'i';
      }
      auVar29 = packssdw(auVar34,auVar34);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._8_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 9] = cVar1 + 'j';
      }
      auVar29 = auVar23 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar44._4_4_ = iVar2;
      auVar44._0_4_ = iVar2;
      auVar44._8_4_ = iVar38;
      auVar44._12_4_ = iVar38;
      auVar52._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar52._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar52._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar52._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar35._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar35._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar35._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar35._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar35 = auVar35 & auVar52;
      auVar29 = packssdw(auVar44,auVar35);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 10] = cVar1 + 'k';
      }
      auVar29 = pshufhw(auVar35,auVar35,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._10_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 0xb] = cVar1 + 'l';
      }
      auVar29 = auVar22 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar45._4_4_ = iVar2;
      auVar45._0_4_ = iVar2;
      auVar45._8_4_ = iVar38;
      auVar45._12_4_ = iVar38;
      auVar53._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar53._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar53._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar53._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar36._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar36._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar36._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar36._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar36 = auVar36 & auVar53;
      auVar29 = pshuflw(auVar45,auVar36,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 0xc] = cVar1 + 'm';
      }
      auVar29 = packssdw(auVar36,auVar36);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._12_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 0xd] = cVar1 + 'n';
      }
      auVar29 = auVar20 ^ _DAT_001080c0;
      iVar2 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar46._4_4_ = iVar2;
      auVar46._0_4_ = iVar2;
      auVar46._8_4_ = iVar38;
      auVar46._12_4_ = iVar38;
      auVar54._0_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar54._4_4_ = -(uint)(iVar2 < -0x7fffffe1);
      auVar54._8_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar54._12_4_ = -(uint)(iVar38 < -0x7fffffe1);
      auVar37._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar37._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar37._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar37._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar37 = auVar37 & auVar54;
      auVar29 = packssdw(auVar46,auVar37);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_768[lVar8 + 0xe] = cVar1 + 'o';
      }
      auVar29 = pshufhw(auVar37,auVar37,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._14_2_ >> 8 & 1) != 0) {
        acStack_768[lVar8 + 0xf] = cVar1 + 'p';
      }
      lVar8 = lVar8 + 0x10;
      lVar21 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + 0x10;
      auVar28._8_8_ = lVar21 + 0x10;
      lVar21 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 0x10;
      auVar27._8_8_ = lVar21 + 0x10;
      lVar21 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 0x10;
      auVar26._8_8_ = lVar21 + 0x10;
      lVar21 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 0x10;
      auVar25._8_8_ = lVar21 + 0x10;
      lVar21 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 0x10;
      auVar24._8_8_ = lVar21 + 0x10;
      lVar21 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 0x10;
      auVar23._8_8_ = lVar21 + 0x10;
      lVar21 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 0x10;
      auVar22._8_8_ = lVar21 + 0x10;
      lVar21 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 0x10;
      auVar20._8_8_ = lVar21 + 0x10;
    } while (lVar8 != 0x20);
    pvVar16 = pvVar5;
    pcStack_4c8 = pcVar10;
    iVar2 = vmemcache_put(pvVar5,"KEY",4,pcVar10,0x20);
    if (iVar2 == 0) {
      lVar8 = 0;
      pVVar3 = (VMEMcache *)&lStack_4d0;
      while( true ) {
        sVar6 = vmemcache_get(pvVar5,"KEY",4,*(undefined8 *)((long)apuStack_6d8 + lVar8),
                              *(undefined8 *)((long)apuStack_6d8 + lVar8 + 8),
                              *(undefined8 *)((long)alStack_6c8 + lVar8),pVVar3);
        sVar4 = *(size_t *)((long)alStack_6c8 + lVar8 + 8);
        if (sVar6 != sVar4) break;
        if (lStack_4d0 != 0x20) {
          test_offsets_cold_4();
          break;
        }
        if ((0 < (long)sVar4) &&
           (iVar2 = strncmp(*(char **)((long)apuStack_6d8 + lVar8),
                            pcStack_4c8 + *(long *)((long)alStack_6c8 + lVar8),sVar4), iVar2 != 0))
        goto LAB_00106b2f;
        lVar8 = lVar8 + 0x20;
        if (lVar8 == 0x200) {
          vmemcache_delete(pvVar5);
          return;
        }
      }
      test_offsets_cold_3();
LAB_00106b2f:
      pvVar16 = (void *)((long)apuStack_6d8 + lVar8);
      test_offsets_cold_5();
      goto LAB_00106b42;
    }
  }
  else {
LAB_00106b42:
    builtin_strncpy(pcVar10 + -8,"Gk\x10",4);
    pcVar10[-4] = '\0';
    pcVar10[-3] = '\0';
    pcVar10[-2] = '\0';
    pcVar10[-1] = '\0';
    test_offsets_cold_1();
  }
  *(code **)(pcVar10 + -8) = test_vmemcache_get_stat;
  test_offsets_cold_2();
  *(code ***)(pcVar10 + -8) = &pcStack_498;
  *(VMEMcache **)(pcVar10 + -0x10) = pVVar3;
  pcVar18 = pcVar10 + -0x18;
  *(void **)(pcVar10 + -0x18) = pvVar5;
  pcVar10[-0x20] = '[';
  pcVar10[-0x1f] = 'k';
  pcVar10[-0x1e] = '\x10';
  pcVar10[-0x1d] = '\0';
  pcVar10[-0x1c] = '\0';
  pcVar10[-0x1b] = '\0';
  pcVar10[-0x1a] = '\0';
  pcVar10[-0x19] = '\0';
  uVar9 = vmemcache_new();
  pcVar10[-0x20] = 'k';
  pcVar10[-0x1f] = 'k';
  pcVar10[-0x1e] = '\x10';
  pcVar10[-0x1d] = '\0';
  pcVar10[-0x1c] = '\0';
  pcVar10[-0x1b] = '\0';
  pcVar10[-0x1a] = '\0';
  pcVar10[-0x19] = '\0';
  vmemcache_set_size(uVar9,0x100000);
  pcVar10[-0x20] = 'x';
  pcVar10[-0x1f] = 'k';
  pcVar10[-0x1e] = '\x10';
  pcVar10[-0x1d] = '\0';
  pcVar10[-0x1c] = '\0';
  pcVar10[-0x1b] = '\0';
  pcVar10[-0x1a] = '\0';
  pcVar10[-0x19] = '\0';
  vmemcache_set_extent_size(uVar9,0x100);
  pcVar10[-0x20] = -0x7d;
  pcVar10[-0x1f] = 'k';
  pcVar10[-0x1e] = '\x10';
  pcVar10[-0x1d] = '\0';
  pcVar10[-0x1c] = '\0';
  pcVar10[-0x1b] = '\0';
  pcVar10[-0x1a] = '\0';
  pcVar10[-0x19] = '\0';
  pvVar5 = pvVar16;
  iVar2 = vmemcache_add(uVar9);
  if (iVar2 == 0) {
    pcVar18 = pcVar10 + -0x28;
    pvVar5 = (void *)0x0;
    pcVar10[-0x30] = -0x62;
    pcVar10[-0x2f] = 'k';
    pcVar10[-0x2e] = '\x10';
    pcVar10[-0x2d] = '\0';
    pcVar10[-0x2c] = '\0';
    pcVar10[-0x2b] = '\0';
    pcVar10[-0x2a] = '\0';
    pcVar10[-0x29] = '\0';
    iVar2 = vmemcache_get_stat(uVar9,0,pcVar18,9);
    if (iVar2 != 0) {
      pcVar10[-0x30] = -0x59;
      pcVar10[-0x2f] = 'k';
      pcVar10[-0x2e] = '\x10';
      pcVar10[-0x2d] = '\0';
      pcVar10[-0x2c] = '\0';
      pcVar10[-0x2b] = '\0';
      pcVar10[-0x2a] = '\0';
      pcVar10[-0x29] = '\0';
      piVar7 = __errno_location();
      if (*piVar7 == 0x16) {
        pcVar10[-0x30] = -0x4c;
        pcVar10[-0x2f] = 'k';
        pcVar10[-0x2e] = '\x10';
        pcVar10[-0x2d] = '\0';
        pcVar10[-0x2c] = '\0';
        pcVar10[-0x2b] = '\0';
        pcVar10[-0x2a] = '\0';
        pcVar10[-0x29] = '\0';
        vmemcache_delete(uVar9);
        return;
      }
      goto LAB_00106bc7;
    }
  }
  else {
    pcVar10[-0x20] = -0x3e;
    pcVar10[-0x1f] = 'k';
    pcVar10[-0x1e] = '\x10';
    pcVar10[-0x1d] = '\0';
    pcVar10[-0x1c] = '\0';
    pcVar10[-0x1b] = '\0';
    pcVar10[-0x1a] = '\0';
    pcVar10[-0x19] = '\0';
    test_vmemcache_get_stat_cold_1();
  }
  pcVar18[-8] = -0x39;
  pcVar18[-7] = 'k';
  pcVar18[-6] = '\x10';
  pcVar18[-5] = '\0';
  pcVar18[-4] = '\0';
  pcVar18[-3] = '\0';
  pcVar18[-2] = '\0';
  pcVar18[-1] = '\0';
  test_vmemcache_get_stat_cold_3();
LAB_00106bc7:
  *(code **)(pcVar18 + -8) = verify_stat_entries;
  test_vmemcache_get_stat_cold_2();
  *(char **)(pcVar18 + -8) = pcVar10 + -8;
  *(undefined8 *)(pcVar18 + -0x10) = uVar9;
  *(undefined8 *)(pcVar18 + -0x18) = extraout_RAX;
  __dest = (void *)0x8;
  pcVar18[-0x20] = -0x15;
  pcVar18[-0x1f] = 'k';
  pcVar18[-0x1e] = '\x10';
  pcVar18[-0x1d] = '\0';
  pcVar18[-0x1c] = '\0';
  pcVar18[-0x1b] = '\0';
  pcVar18[-0x1a] = '\0';
  pcVar18[-0x19] = '\0';
  iVar2 = vmemcache_get_stat();
  if (iVar2 == -1) {
    builtin_strncpy(pcVar18 + -0x20,"\x02l\x10",4);
    pcVar18[-0x1c] = '\0';
    pcVar18[-0x1b] = '\0';
    pcVar18[-0x1a] = '\0';
    pcVar18[-0x19] = '\0';
    verify_stat_entries_cold_2();
  }
  else if (*(void **)(pcVar18 + -0x18) == pvVar5) {
    return;
  }
  *(code **)(pcVar18 + -0x20) = on_evict_test_evict_cb;
  __src = pvVar5;
  verify_stat_entries_cold_1();
  *(char **)(pcVar18 + -0x20) = pcVar18 + -8;
  *(long *)((long)__dest + 0x118) = *(long *)((long)__dest + 0x118) + 1;
  *(long *)(pcVar18 + -0x30) = (long)__dest + 0x108;
  pcVar18[-0x38] = '7';
  pcVar18[-0x37] = 'l';
  pcVar18[-0x36] = '\x10';
  pcVar18[-0x35] = '\0';
  pcVar18[-0x34] = '\0';
  pcVar18[-0x33] = '\0';
  pcVar18[-0x32] = '\0';
  pcVar18[-0x31] = '\0';
  lVar8 = vmemcache_get();
  if (lVar8 < 0) {
    builtin_strncpy(pcVar18 + -0x38,"Ol\x10",4);
    pcVar18[-0x34] = '\0';
    pcVar18[-0x33] = '\0';
    pcVar18[-0x32] = '\0';
    pcVar18[-0x31] = '\0';
    on_evict_test_evict_cb_cold_2();
  }
  else if (lVar8 == 0x100) {
    return;
  }
  *(code **)(pcVar18 + -0x38) = on_miss_test_evict_cb;
  on_evict_test_evict_cb_cold_1();
  *(char **)(pcVar18 + -0x38) = pcVar18 + -0x20;
  *(void **)(pcVar18 + -0x40) = pvVar16;
  *(void **)(pcVar18 + -0x48) = pvVar5;
  *(long *)((long)__dest + 0x110) = *(long *)((long)__dest + 0x110) + 1;
  __n = extraout_RDX;
  if (*(ulong *)((long)__dest + 0x100) < extraout_RDX) {
    __n = *(ulong *)((long)__dest + 0x100);
  }
  pcVar18[-0x50] = -0x7c;
  pcVar18[-0x4f] = 'l';
  pcVar18[-0x4e] = '\x10';
  pcVar18[-0x4d] = '\0';
  pcVar18[-0x4c] = '\0';
  pcVar18[-0x4b] = '\0';
  pcVar18[-0x4a] = '\0';
  pcVar18[-0x49] = '\0';
  memcpy(__dest,__src,__n);
  *(ulong *)((long)__dest + 0x108) = __n;
  return;
LAB_001063c0:
  pcStack_498 = (code *)0x1063c5;
  test_merge_allocations_cold_4();
LAB_001063c5:
  pcStack_498 = (code *)0x1063ca;
  test_merge_allocations_cold_1();
  goto LAB_001063ca;
}

Assistant:

static void
test_memory_leaks(const char *dir, int key_gt_1K,
			enum vmemcache_repl_p repl_p,
			unsigned seed)
{
	char *vbuf;
	char *get_buf;
	size_t size;
	size_t vsize;
	int ret;
	ssize_t get_ret;
	struct big_key bk;

	srand(seed);

	stat_t n_puts = 0;
	stat_t n_evicts = 0;
	stat_t n_gets = 0;

	size_t min_size = VMEMCACHE_MIN_EXTENT / 2;
	size_t max_size = VMEMCACHE_MIN_POOL / 16;

	VMEMcache *cache = vmemcache_new();
	vmemcache_set_size(cache, VMEMCACHE_MIN_POOL);
	vmemcache_set_extent_size(cache, VMEMCACHE_MIN_EXTENT);
	vmemcache_set_eviction_policy(cache, repl_p);
	if (vmemcache_add(cache, dir))
		UT_FATAL("vmemcache_new: %s", vmemcache_errormsg());

	vmemcache_callback_on_evict(cache, on_evict_test_memory_leaks_cb,
					&n_evicts);

	while (n_evicts < 1000) {
		size = min_size + (size_t)rand() % (max_size - min_size + 1);

		vbuf = malloc(size);
		if (vbuf == NULL)
			UT_FATAL("out of memory");
		memset(vbuf, 42, size - 1);
		vbuf[size - 1] = '\0';

		if (key_gt_1K) {
			memset(bk.buf, 42 /* arbitrary */, sizeof(bk.buf));
			bk.n_puts = n_puts;

			ret = vmemcache_put(cache, &bk, sizeof(bk), vbuf, size);
		} else {
			ret = vmemcache_put(cache, &n_puts, sizeof(n_puts),
						vbuf, size);
		}

		if (ret)
			UT_FATAL(
				"vmemcache_put(n_puts: %llu n_evicts: %llu): %s",
				n_puts, n_evicts, vmemcache_errormsg());

		get_buf = malloc(size);
		if (get_buf == NULL)
			UT_FATAL("out of memory");
		if (key_gt_1K)
			get_ret = vmemcache_get(cache, &bk, sizeof(bk), get_buf,
							size, 0, &vsize);
		else
			get_ret = vmemcache_get(cache, &n_puts, sizeof(n_puts),
							get_buf, size, 0,
							&vsize);
		if (get_ret < 0)
			UT_FATAL("vmemcache_get: %s", vmemcache_errormsg());

		if ((size_t)get_ret != size)
			UT_FATAL(
				"vmemcache_get: wrong return value: %zi (should be %zu)",
				get_ret, size);

		if (size != vsize)
			UT_FATAL(
				"vmemcache_get: wrong size of value: %zi (should be %zu)",
				vsize, size);

		if (strcmp(vbuf, get_buf))
			UT_FATAL(
				"vmemcache_get: wrong value: %s (should be %s)",
				get_buf, vbuf);

		free(vbuf);
		free(get_buf);

		n_gets++;
		n_puts++;
	}

	verify_stat_entries(cache, n_puts - n_evicts);

	/* free all the memory */
	while (vmemcache_evict(cache, NULL, 0) == 0)
		;

	/* check statistics */
	verify_stats(cache, n_puts, n_gets, n_gets, 0, n_evicts, 0, 0, 0);

	vmemcache_delete(cache);

	if (n_evicts != n_puts)
		UT_FATAL("memory leak detected");
}